

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Le
          (PortalImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  ulong uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Bounds2f BVar11;
  SampledSpectrum SVar12;
  Point2f st;
  Tuple2<pbrt::Point2,_float> local_40;
  undefined1 local_38 [16];
  Tuple3<pbrt::Vector3,_float> local_28;
  undefined1 extraout_var [56];
  undefined1 auVar4 [56];
  undefined1 auVar7 [56];
  
  uVar1._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar1._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  local_28.z = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_4_ = (float)(undefined4)uVar1 * (float)(undefined4)uVar1;
  auVar9._4_4_ = (float)uVar1._4_4_ * (float)uVar1._4_4_;
  auVar9._8_8_ = 0;
  auVar9 = vmovshdup_avx(auVar9);
  auVar9 = vfmadd231ss_fma(auVar9,auVar5,auVar5);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)local_28.z),ZEXT416((uint)local_28.z));
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  fVar8 = auVar9._0_4_;
  auVar10._4_4_ = fVar8;
  auVar10._0_4_ = fVar8;
  auVar10._8_4_ = fVar8;
  auVar10._12_4_ = fVar8;
  local_28.z = local_28.z / fVar8;
  auVar9 = vdivps_avx(auVar5,auVar10);
  auVar7 = ZEXT856(auVar9._8_8_);
  local_28._0_8_ = vmovlps_avx(auVar9);
  auVar2._0_8_ = ImageFromRender(this,(Vector3f *)&local_28,(Float *)0x0);
  auVar2._8_56_ = extraout_var;
  local_38 = auVar2._0_16_;
  local_40 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_38);
  auVar4 = extraout_var;
  BVar11 = ImageBounds(this,&ray->o);
  auVar6._0_8_ = BVar11.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar6._8_56_ = auVar7;
  auVar3._0_8_ = BVar11.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar3._8_56_ = auVar4;
  if (((local_38._0_4_ < BVar11.pMin.super_Tuple2<pbrt::Point2,_float>.x) ||
      (BVar11.pMax.super_Tuple2<pbrt::Point2,_float>.x < local_38._0_4_)) ||
     (uVar1 = vcmpps_avx512vl(auVar3._0_16_,local_38,2), (uVar1 & 2) == 0)) {
    SVar12.values.values = (array<float,_4>)ZEXT816(0);
  }
  else {
    uVar1 = vcmpps_avx512vl(local_38,auVar6._0_16_,2);
    SVar12.values.values = (array<float,_4>)ZEXT816(0);
    if ((uVar1 >> 1 & 1) != 0) {
      SVar12 = ImageLookup(this,(Point2f *)&local_40,lambda);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar12;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Le(const Ray &ray,
                                             const SampledWavelengths &lambda) const {
    // Ignore world to light...
    Vector3f w = Normalize(ray.d);
    Point2f st = ImageFromRender(w);

    if (!Inside(st, ImageBounds(ray.o)))
        return SampledSpectrum(0.f);

    return ImageLookup(st, lambda);
}